

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O2

void rw::d3d9::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  ushort uVar1;
  uint uVar2;
  Geometry *geometry;
  uint uVar3;
  InstanceDataHeader *pIVar4;
  undefined8 uVar5;
  void *indexBuffer;
  uint16 *puVar6;
  uint uVar7;
  uint32 j;
  ulong uVar8;
  uint32 i;
  uint uVar9;
  uint uVar10;
  MeshHeader *pMVar11;
  uint *puVar12;
  
  geometry = atomic->geometry;
  if ((geometry->flags & 0x1000000) != 0) {
    return;
  }
  pIVar4 = geometry->instData;
  if (pIVar4 == (InstanceDataHeader *)0x0) {
LAB_00111a1a:
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 347"
    ;
    pIVar4 = (InstanceDataHeader *)(*DAT_00143848)(0x70,0x3000f);
    pMVar11 = geometry->meshHeader;
    pIVar4->platform = 9;
    pIVar4[1].platform = (uint)pMVar11->serialNum;
    uVar1 = pMVar11->numMeshes;
    pIVar4[2].platform = (uint)uVar1;
    pIVar4[6].platform = pMVar11->flags == 1 | 4;
    pIVar4[0x14].platform = 0;
    *(undefined8 *)(pIVar4 + 0x16) = 0;
    pIVar4[0x19].platform = geometry->numVertices;
    pIVar4[0x18].platform = pMVar11->totalIndices;
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 358"
    ;
    uVar5 = (*DAT_00143848)((ulong)uVar1 * 0x30);
    *(undefined8 *)(pIVar4 + 0x1a) = uVar5;
    uVar10 = 0;
    indexBuffer = d3d::createIndexBuffer(pIVar4[0x18].platform * 2,false);
    *(void **)(pIVar4 + 4) = indexBuffer;
    puVar6 = d3d::lockIndices(indexBuffer,0,0,0);
    puVar12 = *(uint **)(pIVar4 + 0x1a);
    pMVar11 = pMVar11 + 1;
    for (uVar9 = 0; uVar9 < pIVar4[2].platform; uVar9 = uVar9 + 1) {
      findMinVertAndNumVertices
                (*(uint16 **)pMVar11,pMVar11->totalIndices,puVar12 + 1,(int32 *)(puVar12 + 9));
      uVar7 = pMVar11->totalIndices;
      *puVar12 = uVar7;
      *(undefined8 *)(puVar12 + 2) = *(undefined8 *)(pMVar11 + 1);
      puVar12[4] = 0;
      puVar12[6] = 0;
      puVar12[7] = 0;
      uVar2 = puVar12[1];
      puVar12[8] = uVar2;
      puVar12[10] = uVar10;
      if (pIVar4[6].platform == 5) {
        uVar3 = uVar7 - 2;
      }
      else {
        uVar3 = uVar7 / 3;
      }
      puVar12[0xb] = uVar3;
      if (uVar2 == 0) {
        memcpy(puVar6 + uVar10,*(void **)pMVar11,(ulong)(uVar7 * 2));
        uVar7 = *puVar12;
      }
      else {
        for (uVar8 = 0; uVar7 != uVar8; uVar8 = uVar8 + 1) {
          puVar6[uVar10 + (int)uVar8] = *(short *)(*(long *)pMVar11 + uVar8 * 2) - (short)uVar2;
        }
      }
      uVar10 = uVar10 + uVar7;
      pMVar11 = (MeshHeader *)&pMVar11[1].totalIndices;
      puVar12 = puVar12 + 0xc;
    }
    d3d::unlockIndices(*(void **)(pIVar4 + 4));
    *(undefined8 *)(pIVar4 + 0x10) = 0;
    *(undefined8 *)(pIVar4 + 0x12) = 0;
    *(undefined8 *)(pIVar4 + 0xc) = 0;
    *(undefined8 *)(pIVar4 + 0xe) = 0;
    *(undefined8 *)(pIVar4 + 8) = 0;
    *(undefined8 *)(pIVar4 + 10) = 0;
    geometry->instData = pIVar4;
    (**(code **)&rwpipe[1].super_Pipeline)(geometry,pIVar4,0);
  }
  else {
    if (pIVar4[1].platform != (uint)geometry->meshHeader->serialNum) {
      freeInstanceData(geometry);
      pIVar4 = geometry->instData;
      if (pIVar4 == (InstanceDataHeader *)0x0) goto LAB_00111a1a;
    }
    if (geometry->lockedSinceInst != 0) {
      (**(code **)&rwpipe[1].super_Pipeline)(geometry,pIVar4,1);
    }
  }
  geometry->lockedSinceInst = 0;
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// don't try to (re)instance native data
	if(geo->flags & Geometry::NATIVE)
		return;

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	if(geo->instData){
		// Already have instanced data, so check if we have to reinstance
		assert(header->platform == PLATFORM_D3D9);
		if(header->serialNumber != geo->meshHeader->serialNum){
			// Mesh changed, so reinstance everything
			freeInstanceData(geo);
		}
	}

	// no instance or complete reinstance
	if(geo->instData == nil){
		geo->instData = instanceMesh(rwpipe, geo);
		pipe->instanceCB(geo, (InstanceDataHeader*)geo->instData, 0);
	}else if(geo->lockedSinceInst)
		pipe->instanceCB(geo, (InstanceDataHeader*)geo->instData, 1);

	geo->lockedSinceInst = 0;
}